

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChShaftsMotor.cpp
# Opt level: O3

void __thiscall chrono::ChShaftsMotor::ConstraintsFbLoadForces(ChShaftsMotor *this,double factor)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  ulong *local_30;
  long local_28;
  
  if (this->motor_mode != MOT_MODE_TORQUE) {
    return;
  }
  dVar1 = this->motor_torque;
  ChVariables::Get_fb((ChVectorRef *)&local_30,
                      &(((this->super_ChShaftsMotorBase).super_ChShaftsCouple.shaft1)->variables).
                       super_ChVariables);
  if (0 < local_28) {
    auVar4._8_8_ = 0;
    auVar4._0_8_ = dVar1;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = factor;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = *local_30;
    auVar2 = vfmadd213sd_fma(auVar4,auVar6,auVar2);
    *local_30 = auVar2._0_8_;
    dVar1 = this->motor_torque;
    ChVariables::Get_fb((ChVectorRef *)&local_30,
                        &(((this->super_ChShaftsMotorBase).super_ChShaftsCouple.shaft2)->variables).
                         super_ChVariables);
    if (0 < local_28) {
      auVar5._8_8_ = 0;
      auVar5._0_8_ = factor;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = dVar1;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = *local_30;
      auVar2 = vfnmadd213sd_fma(auVar5,auVar7,auVar3);
      *local_30 = auVar2._0_8_;
      return;
    }
  }
  __assert_fail("index >= 0 && index < size()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                "Scalar &Eigen::DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double, -1, 1>>, 1>::operator()(Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, 1>>, Level = 1]"
               );
}

Assistant:

void ChShaftsMotor::ConstraintsFbLoadForces(double factor) {
    if (motor_mode == MOT_MODE_TORQUE) {
        shaft1->Variables().Get_fb()(0) += motor_torque * factor;
        shaft2->Variables().Get_fb()(0) += -motor_torque * factor;
    }
}